

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

AstNode * new_symbol_reference(ParserState *parser,StringObject *varname)

{
  LuaSymbol *pLVar1;
  AstNode *pAVar2;
  AstNode *symbol_expr;
  CompilerState *pCStack_38;
  _Bool is_local_1;
  LuaSymbol *global;
  CompilerState *compiler_state;
  LuaSymbol *symbol;
  LinearizerState *pLStack_18;
  _Bool is_local;
  StringObject *varname_local;
  ParserState *parser_local;
  
  symbol._7_1_ = 0;
  pLStack_18 = (LinearizerState *)varname;
  varname_local = (StringObject *)parser;
  compiler_state = (CompilerState *)search_for_variable(parser,varname,(_Bool *)((long)&symbol + 7))
  ;
  if (compiler_state == (CompilerState *)0x0) {
    global = *(LuaSymbol **)&varname_local->hash;
    pCStack_38 = (CompilerState *)
                 (**(code **)(*(long *)global + 0x10))(**(undefined8 **)global,1,0x48);
    *(undefined4 *)&pCStack_38->allocator = 2;
    pCStack_38->linearizer = pLStack_18;
    pCStack_38->error_handler = (_func_int_char_ptr_varargs *)0x0;
    set_type((VariableType *)&pCStack_38->strings,RAVI_TANY);
    compiler_state = pCStack_38;
    add_upvalue_for_ENV((ParserState *)varname_local);
    pLVar1 = search_for_variable((ParserState *)varname_local,
                                 *(StringObject **)(*(long *)&varname_local->hash + 0x128),
                                 (_Bool *)((long)&symbol_expr + 7));
    (pCStack_38->buff).buf = (char *)pLVar1;
    if ((pCStack_38->buff).buf == (char *)0x0) {
      __assert_fail("global->variable.env",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/parser.c"
                    ,0x1d4,"AstNode *new_symbol_reference(ParserState *, const StringObject *)");
    }
  }
  else if (((symbol._7_1_ & 1) == 0) && (*(SymbolType *)&compiler_state->allocator == SYM_LOCAL)) {
    add_upvalue_in_levels_upto
              ((ParserState *)varname_local,(AstNode *)varname_local->str,
               *(AstNode **)compiler_state->error_handler,(LuaSymbol *)compiler_state);
    compiler_state =
         (CompilerState *)
         search_upvalue_in_function((AstNode *)varname_local->str,(StringObject *)pLStack_18);
  }
  else if ((*(SymbolType *)&compiler_state->allocator == SYM_UPVALUE) &&
          (compiler_state->error_handler != (_func_int_char_ptr_varargs *)varname_local->str)) {
    add_upvalue_in_levels_upto
              ((ParserState *)varname_local,(AstNode *)varname_local->str,
               (AstNode *)compiler_state->error_handler,(LuaSymbol *)compiler_state->linearizer);
    compiler_state =
         (CompilerState *)
         search_upvalue_in_function((AstNode *)varname_local->str,(StringObject *)pLStack_18);
  }
  pAVar2 = allocate_expr_ast_node((ParserState *)varname_local,EXPR_SYMBOL);
  (pAVar2->field_2).return_stmt.expr_list = (AstNodeList *)compiler_state->strings;
  (pAVar2->field_2).goto_stmt.name = (StringObject *)compiler_state->main_function;
  (pAVar2->field_2).function_stmt.function_expr = (AstNode *)compiler_state;
  return pAVar2;
}

Assistant:

static AstNode *new_symbol_reference(ParserState *parser, const StringObject *varname)
{
	bool is_local = false;
	LuaSymbol *symbol = search_for_variable(parser, varname, &is_local); // Search in all scopes
	if (symbol) {
		// TODO we had a bug here - see t013.lua
		// Need more test cases for this
		// we found a local or upvalue
		if (!is_local && symbol->symbol_type == SYM_LOCAL) {
			// If the local symbol occurred in a parent function then we
			// need to construct an upvalue. Lua requires that the upvalue be
			// added to all functions in the tree up to the function where the local
			// is defined.
			add_upvalue_in_levels_upto(parser, parser->current_function, symbol->variable.block->function,
						   symbol);
			// TODO Following search could be avoided if above returned the symbol
			symbol = search_upvalue_in_function(parser->current_function, varname);
		} else if (symbol->symbol_type == SYM_UPVALUE &&
			   symbol->upvalue.target_variable_function != parser->current_function) {
			// We found an upvalue but it is not at the same level
			// Ensure all levels have the upvalue
			// Note that if the uvalue refers to special _ENV symbol then target function will be NULL
			add_upvalue_in_levels_upto(parser, parser->current_function, symbol->upvalue.target_variable_function,
						   symbol->upvalue.target_variable);
			// TODO Following search could be avoided if above returned the symbol
			symbol = search_upvalue_in_function(parser->current_function, varname);
		}
	} else {
		// Return global symbol
		CompilerState *compiler_state = parser->compiler_state;
		LuaSymbol *global = (LuaSymbol * ) compiler_state->allocator->calloc(compiler_state->allocator->arena, 1, sizeof(LuaSymbol));
		global->symbol_type = SYM_GLOBAL;
		global->variable.var_name = varname;
		global->variable.block = NULL;
		set_type(&global->variable.value_type, RAVI_TANY); // Globals are always ANY type
		// We don't add globals to any scope so that they are
		// always looked up
		symbol = global;
		// Since we have a global reference we need to add upvalue for _ENV
		// At the parser level we do not try to model that the global reference will be
		// resolved by _ENV[name] - we leave that to the code generator to decide.
		// However adding an upvalue later is hard so we do it here.
		add_upvalue_for_ENV(parser);
		bool is_local;
		global->variable.env = search_for_variable(parser, parser->compiler_state->_ENV, &is_local);
		assert(global->variable.env);
	}
	AstNode *symbol_expr = allocate_expr_ast_node(parser, EXPR_SYMBOL);
	symbol_expr->symbol_expr.type = symbol->variable.value_type;
	symbol_expr->symbol_expr.var = symbol;
	return symbol_expr;
}